

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::CharSetLeaf::IsSubsetOf(CharSetLeaf *this,uint level,CharSetNode *other)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x324,"(level == 0)","level == 0");
    if (!bVar3) goto LAB_00e6ee77;
    *puVar5 = 0;
  }
  if (other == (CharSetNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x325,"(other != nullptr)","other != nullptr");
    if (!bVar3) goto LAB_00e6ee77;
    *puVar5 = 0;
  }
  if (other == (CharSetNode *)&CharSetFull::Instance) {
    bVar3 = true;
  }
  else {
    iVar4 = (*other->_vptr_CharSetNode[0xd])(other);
    if ((char)iVar4 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,0x328,"(other->IsLeaf())","other->IsLeaf()");
      if (!bVar3) {
LAB_00e6ee77:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (((this->vec).vec[0] & ~*(uint *)&other[1]._vptr_CharSetNode) == 0) {
      uVar2 = 0;
      do {
        uVar6 = uVar2;
        if (uVar6 == 7) break;
        uVar2 = uVar6 + 1;
      } while (((this->vec).vec[uVar6 + 1] &
               ~*(uint *)((long)&other[1]._vptr_CharSetNode + uVar6 * 4 + 4)) == 0);
      bVar3 = 6 < uVar6;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool CharSetLeaf::IsSubsetOf(uint level, const CharSetNode* other) const
    {
        Assert(level == 0);
        Assert(other != nullptr);
        if (other == CharSetFull::TheFullNode)
            return true;
        Assert(other->IsLeaf());
        CharSetLeaf* otherLeaf = (CharSetLeaf*)other;
        return vec.IsSubsetOf(otherLeaf->vec);
    }